

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O3

int testMultiFunctionTopLevelFeatureDescriptionsMustBeEmpty(void)

{
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong uVar3;
  Rep *pRVar4;
  ModelDescription *interface;
  bool bVar5;
  ResultType RVar6;
  FunctionDescription *obj;
  ostream *poVar7;
  void *pvVar8;
  FeatureDescription *pFVar9;
  undefined8 *puVar10;
  int iVar11;
  Arena *arena;
  Model m;
  ValidationPolicy local_7c;
  Result local_78;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50,(Arena *)0x0,false);
  local_7c.allowsEmptyInput = true;
  local_7c.allowsEmptyOutput = true;
  local_7c.allowsMultipleFunctions = true;
  local_7c.allowsStatefulPrediction = false;
  if (local_50.description_ == (ModelDescription *)0x0) {
    arena = (Arena *)(local_50.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_50.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      arena = *(Arena **)arena;
    }
    local_50.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>(arena)
    ;
  }
  interface = local_50.description_;
  uVar3 = ((local_50.description_)->super_MessageLite)._internal_metadata_.ptr_;
  puVar10 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
  if ((uVar3 & 1) != 0) {
    puVar10 = (undefined8 *)*puVar10;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&(local_50.description_)->defaultfunctionname_,"foo",puVar10);
  pRVar4 = (interface->functions_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001424bc:
    obj = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FunctionDescription>
                    ((interface->functions_).super_RepeatedPtrFieldBase.arena_);
    pvVar8 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                       (&(interface->functions_).super_RepeatedPtrFieldBase,obj);
  }
  else {
    iVar11 = (interface->functions_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar11) goto LAB_001424bc;
    (interface->functions_).super_RepeatedPtrFieldBase.current_size_ = iVar11 + 1;
    pvVar8 = pRVar4->elements[iVar11];
  }
  puVar10 = (undefined8 *)(*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar8 + 8) & 1) != 0) {
    puVar10 = (undefined8 *)*puVar10;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar8 + 0x58),"foo",puVar10);
  CoreML::validateModelDescription(&local_78,interface,9,&local_7c);
  bVar5 = CoreML::Result::good(&local_78);
  paVar2 = &local_78.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.m_message._M_dataplus._M_p,
                    local_78.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    pRVar1 = &interface->input_;
    pRVar4 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar4 == (Rep *)0x0) {
LAB_00142602:
      pFVar9 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                         ((pRVar1->super_RepeatedPtrFieldBase).arena_);
      pvVar8 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                         (&pRVar1->super_RepeatedPtrFieldBase,pFVar9);
    }
    else {
      iVar11 = (interface->input_).super_RepeatedPtrFieldBase.current_size_;
      if (pRVar4->allocated_size <= iVar11) goto LAB_00142602;
      (interface->input_).super_RepeatedPtrFieldBase.current_size_ = iVar11 + 1;
      pvVar8 = pRVar4->elements[iVar11];
    }
    puVar10 = (undefined8 *)(*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar8 + 8) & 1) != 0) {
      puVar10 = (undefined8 *)*puVar10;
    }
    google::protobuf::internal::ArenaStringPtr::
    Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
              ((ArenaStringPtr *)((long)pvVar8 + 0x10),"x",puVar10);
    CoreML::validateModelDescription(&local_78,interface,9,&local_7c);
    bVar5 = CoreML::Result::good(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_78.m_message._M_dataplus._M_p,
                      local_78.m_message.field_2._M_allocated_capacity + 1);
    }
    if (bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x14c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    }
    else {
      CoreML::validateModelDescription(&local_78,interface,9,&local_7c);
      RVar6 = CoreML::Result::type(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.m_message._M_dataplus._M_p != paVar2) {
        operator_delete(local_78.m_message._M_dataplus._M_p,
                        local_78.m_message.field_2._M_allocated_capacity + 1);
      }
      if (RVar6 == INVALID_MODEL_INTERFACE) {
        google::protobuf::internal::RepeatedPtrFieldBase::
        Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                  (&pRVar1->super_RepeatedPtrFieldBase);
        pRVar1 = &interface->output_;
        pRVar4 = (interface->output_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar4 == (Rep *)0x0) {
LAB_00142824:
          pFVar9 = google::protobuf::Arena::
                   CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                             ((pRVar1->super_RepeatedPtrFieldBase).arena_);
          pvVar8 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                             (&pRVar1->super_RepeatedPtrFieldBase,pFVar9);
        }
        else {
          iVar11 = (interface->output_).super_RepeatedPtrFieldBase.current_size_;
          if (pRVar4->allocated_size <= iVar11) goto LAB_00142824;
          (interface->output_).super_RepeatedPtrFieldBase.current_size_ = iVar11 + 1;
          pvVar8 = pRVar4->elements[iVar11];
        }
        puVar10 = (undefined8 *)(*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffc);
        if ((*(ulong *)((long)pvVar8 + 8) & 1) != 0) {
          puVar10 = (undefined8 *)*puVar10;
        }
        google::protobuf::internal::ArenaStringPtr::
        Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                  ((ArenaStringPtr *)((long)pvVar8 + 0x10),"y",puVar10);
        CoreML::validateModelDescription(&local_78,interface,9,&local_7c);
        bVar5 = CoreML::Result::good(&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.m_message._M_dataplus._M_p != paVar2) {
          operator_delete(local_78.m_message._M_dataplus._M_p,
                          local_78.m_message.field_2._M_allocated_capacity + 1);
        }
        if (bVar5) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                     ,0x66);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x150);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
                     ,0x6b);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        }
        else {
          CoreML::validateModelDescription(&local_78,interface,9,&local_7c);
          RVar6 = CoreML::Result::type(&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78.m_message._M_dataplus._M_p != paVar2) {
            operator_delete(local_78.m_message._M_dataplus._M_p,
                            local_78.m_message.field_2._M_allocated_capacity + 1);
          }
          if (RVar6 == INVALID_MODEL_INTERFACE) {
            google::protobuf::internal::RepeatedPtrFieldBase::
            Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                      (&pRVar1->super_RepeatedPtrFieldBase);
            pRVar1 = &interface->traininginput_;
            pRVar4 = (interface->traininginput_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_00142a73:
              pFVar9 = google::protobuf::Arena::
                       CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                                 ((pRVar1->super_RepeatedPtrFieldBase).arena_);
              pvVar8 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                 (&pRVar1->super_RepeatedPtrFieldBase,pFVar9);
            }
            else {
              iVar11 = (interface->traininginput_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar11) goto LAB_00142a73;
              (interface->traininginput_).super_RepeatedPtrFieldBase.current_size_ = iVar11 + 1;
              pvVar8 = pRVar4->elements[iVar11];
            }
            puVar10 = (undefined8 *)(*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffc);
            if ((*(ulong *)((long)pvVar8 + 8) & 1) != 0) {
              puVar10 = (undefined8 *)*puVar10;
            }
            google::protobuf::internal::ArenaStringPtr::
            Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                      ((ArenaStringPtr *)((long)pvVar8 + 0x10),"z",puVar10);
            CoreML::validateModelDescription(&local_78,interface,9,&local_7c);
            bVar5 = CoreML::Result::good(&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78.m_message._M_dataplus._M_p != paVar2) {
              operator_delete(local_78.m_message._M_dataplus._M_p,
                              local_78.m_message.field_2._M_allocated_capacity + 1);
            }
            if (bVar5) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                         ,0x66);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x154);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,
                         "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
                         ,0x6b);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7," was false, expected true.",0x1a);
            }
            else {
              CoreML::validateModelDescription(&local_78,interface,9,&local_7c);
              RVar6 = CoreML::Result::type(&local_78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78.m_message._M_dataplus._M_p != paVar2) {
                operator_delete(local_78.m_message._M_dataplus._M_p,
                                local_78.m_message.field_2._M_allocated_capacity + 1);
              }
              if (RVar6 == INVALID_MODEL_INTERFACE) {
                google::protobuf::internal::RepeatedPtrFieldBase::
                Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                          (&pRVar1->super_RepeatedPtrFieldBase);
                pFVar9 = CoreML::Specification::ModelDescription::add_state(interface);
                uVar3 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
                puVar10 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
                if ((uVar3 & 1) != 0) {
                  puVar10 = (undefined8 *)*puVar10;
                }
                google::protobuf::internal::ArenaStringPtr::
                Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                          (&pFVar9->name_,"s",puVar10);
                CoreML::validateModelDescription(&local_78,interface,9,&local_7c);
                bVar5 = CoreML::Result::good(&local_78);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78.m_message._M_dataplus._M_p != paVar2) {
                  operator_delete(local_78.m_message._M_dataplus._M_p,
                                  local_78.m_message.field_2._M_allocated_capacity + 1);
                }
                if (bVar5) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                             ,0x66);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x158);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7,
                             "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
                             ,0x6b);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7," was false, expected true.",0x1a);
                }
                else {
                  CoreML::validateModelDescription(&local_78,interface,9,&local_7c);
                  RVar6 = CoreML::Result::type(&local_78);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_78.m_message._M_dataplus._M_p != paVar2) {
                    operator_delete(local_78.m_message._M_dataplus._M_p,
                                    local_78.m_message.field_2._M_allocated_capacity + 1);
                  }
                  if (RVar6 == INVALID_MODEL_INTERFACE) {
                    google::protobuf::internal::RepeatedPtrFieldBase::
                    Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                              (&(interface->state_).super_RepeatedPtrFieldBase);
                    uVar3 = (interface->super_MessageLite)._internal_metadata_.ptr_;
                    puVar10 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
                    if ((uVar3 & 1) != 0) {
                      puVar10 = (undefined8 *)*puVar10;
                    }
                    google::protobuf::internal::ArenaStringPtr::
                    Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                              (&interface->predictedfeaturename_,"f",puVar10);
                    CoreML::validateModelDescription(&local_78,interface,9,&local_7c);
                    bVar5 = CoreML::Result::good(&local_78);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_78.m_message._M_dataplus._M_p != paVar2) {
                      operator_delete(local_78.m_message._M_dataplus._M_p,
                                      local_78.m_message.field_2._M_allocated_capacity + 1);
                    }
                    if (bVar5) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                 ,0x66);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,":",1);
                      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x15c);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar7,
                                 "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
                                 ,0x6b);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar7," was false, expected true.",0x1a);
                    }
                    else {
                      CoreML::validateModelDescription(&local_78,interface,9,&local_7c);
                      RVar6 = CoreML::Result::type(&local_78);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_78.m_message._M_dataplus._M_p != paVar2) {
                        operator_delete(local_78.m_message._M_dataplus._M_p,
                                        local_78.m_message.field_2._M_allocated_capacity + 1);
                      }
                      if (RVar6 == INVALID_MODEL_INTERFACE) {
                        google::protobuf::internal::ArenaStringPtr::ClearToEmpty
                                  (&interface->predictedfeaturename_);
                        uVar3 = (interface->super_MessageLite)._internal_metadata_.ptr_;
                        puVar10 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
                        if ((uVar3 & 1) != 0) {
                          puVar10 = (undefined8 *)*puVar10;
                        }
                        google::protobuf::internal::ArenaStringPtr::
                        Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                                  (&interface->predictedprobabilitiesname_,"f",puVar10);
                        CoreML::validateModelDescription(&local_78,interface,9,&local_7c);
                        bVar5 = CoreML::Result::good(&local_78);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_78.m_message._M_dataplus._M_p != paVar2) {
                          operator_delete(local_78.m_message._M_dataplus._M_p,
                                          local_78.m_message.field_2._M_allocated_capacity + 1);
                        }
                        if (bVar5) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                     ,0x66);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,":",1);
                          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x160);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar7,
                                     "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
                                     ,0x6b);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar7," was false, expected true.",0x1a);
                        }
                        else {
                          CoreML::validateModelDescription(&local_78,interface,9,&local_7c);
                          RVar6 = CoreML::Result::type(&local_78);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_78.m_message._M_dataplus._M_p != paVar2) {
                            operator_delete(local_78.m_message._M_dataplus._M_p,
                                            local_78.m_message.field_2._M_allocated_capacity + 1);
                          }
                          if (RVar6 == INVALID_MODEL_INTERFACE) {
                            iVar11 = 0;
                            google::protobuf::internal::ArenaStringPtr::ClearToEmpty
                                      (&interface->predictedprobabilitiesname_);
                            goto LAB_00142a5c;
                          }
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                     ,0x66);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,":",1);
                          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x160);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar7,
                                     "((ResultType::INVALID_MODEL_INTERFACE)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
                                     ,0x93);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar7," was false, expected true.",0x1a);
                        }
                      }
                      else {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                   ,0x66);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,":",1);
                        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x15c);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,
                                   "((ResultType::INVALID_MODEL_INTERFACE)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
                                   ,0x93);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7," was false, expected true.",0x1a);
                      }
                    }
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                               ,0x66);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x158);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7,
                               "((ResultType::INVALID_MODEL_INTERFACE)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
                               ,0x93);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7," was false, expected true.",0x1a);
                  }
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                           ,0x66);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x154);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,
                           "((ResultType::INVALID_MODEL_INTERFACE)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
                           ,0x93);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7," was false, expected true.",0x1a);
              }
            }
            iVar11 = 1;
            std::endl<char,std::char_traits<char>>(poVar7);
            goto LAB_00142a5c;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                     ,0x66);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x150);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     "((ResultType::INVALID_MODEL_INTERFACE)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
                     ,0x93);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                   ,0x66);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x14c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "((ResultType::INVALID_MODEL_INTERFACE)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
                   ,0x93);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      }
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x149);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).good()"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  }
  std::ostream::put((char)poVar7);
  iVar11 = 1;
  std::ostream::flush();
LAB_00142a5c:
  CoreML::Specification::Model::~Model(&local_50);
  return iVar11;
}

Assistant:

int testMultiFunctionTopLevelFeatureDescriptionsMustBeEmpty() {
    Specification::Model m;

    auto validationPolicy = ValidationPolicy();
    validationPolicy.allowsEmptyInput = true;
    validationPolicy.allowsEmptyOutput = true;
    validationPolicy.allowsMultipleFunctions = true;

    auto *description = m.mutable_description();
    description->set_defaultfunctionname("foo");
    auto *function = description->add_functions();
    function->set_name("foo");

    ML_ASSERT_GOOD(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy));

    description->add_input()->set_name("x");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);
    description->clear_input();

    description->add_output()->set_name("y");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);
    description->clear_output();

    description->add_traininginput()->set_name("z");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);
    description->clear_traininginput();

    description->add_state()->set_name("s");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);
    description->clear_state();

    description->set_predictedfeaturename("f");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);
    description->clear_predictedfeaturename();

    description->set_predictedprobabilitiesname("f");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);
    description->clear_predictedprobabilitiesname();

    return 0;
}